

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

void __thiscall
Refal2::CInternalProgramBuilder::processModules
          (CInternalProgramBuilder *this,CModuleDataVector *modules,
          TProcessFunctionPtr processFunction)

{
  CModuleData *pCVar1;
  code *pcVar2;
  pointer puVar3;
  long in_RCX;
  pointer puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  
  puVar4 = (modules->
           super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (modules->
           super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar3) {
    plVar8 = (long *)((long)&this->errors + in_RCX);
    iVar5 = 0;
    do {
      pCVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>
               ._M_t.
               super__Tuple_impl<0UL,_Refal2::CModuleData_*,_std::default_delete<Refal2::CModuleData>_>
               .super__Head_base<0UL,_Refal2::CModuleData_*,_false>._M_head_impl;
      if (0 < (pCVar1->Functions).size) {
        lVar7 = 8;
        lVar6 = 0;
        do {
          pcVar2 = (code *)processFunction;
          if ((processFunction & 1) != 0) {
            pcVar2 = *(code **)(*plVar8 + -1 + processFunction);
          }
          (*pcVar2)(plVar8,*(undefined8 *)
                            ((long)&(((pCVar1->Functions).keyDataPairs)->key)._M_node + lVar7),iVar5
                   );
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar6 < (pCVar1->Functions).size);
        puVar3 = (modules->
                 super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      iVar5 = iVar5 + 1;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar3);
  }
  return;
}

Assistant:

void CInternalProgramBuilder::processModules( const CModuleDataVector& modules,
	const TProcessFunctionPtr processFunction )
{
	TRuntimeModuleId currentModuleId = 0;
	for( CModuleDataVector::const_iterator module = modules.begin();
		module != modules.end(); ++module )
	{
		const CPreparatoryFunctions& functions = ( *module )->Functions;
		for( int i = 0; i < functions.Size(); i++ ) {
			( this->*processFunction )( functions.GetData( i ).get(),
				currentModuleId );
		}
		currentModuleId++;
	}
}